

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

int enet_address_get_host(ENetAddress *address,char *name,size_t nameLength)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  sockaddr local_30;
  
  local_30.sa_data[6] = '\0';
  local_30.sa_data[7] = '\0';
  local_30.sa_data[8] = '\0';
  local_30.sa_data[9] = '\0';
  local_30.sa_data[10] = '\0';
  local_30.sa_data[0xb] = '\0';
  local_30.sa_data[0xc] = '\0';
  local_30.sa_data[0xd] = '\0';
  local_30.sa_family = 2;
  local_30.sa_data._0_2_ = address->port << 8 | address->port >> 8;
  local_30.sa_data._2_4_ = address->host;
  iVar1 = getnameinfo(&local_30,0x10,name,(socklen_t)nameLength,(char *)0x0,0,8);
  if (iVar1 == -2) {
    iVar2 = enet_address_get_host_ip(address,name,nameLength);
  }
  else {
    iVar2 = -1;
    if (iVar1 == 0) {
      if ((nameLength != 0 && name != (char *)0x0) &&
         (pvVar3 = memchr(name,0,nameLength), pvVar3 == (void *)0x0)) {
        return -1;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
enet_address_get_host (const ENetAddress * address, char * name, size_t nameLength)
{
#ifdef HAS_GETNAMEINFO
    struct sockaddr_in sin;
    int err;

    memset (& sin, 0, sizeof (struct sockaddr_in));

    sin.sin_family = AF_INET;
    sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
    sin.sin_addr.s_addr = address -> host;

    err = getnameinfo ((struct sockaddr *) & sin, sizeof (sin), name, nameLength, NULL, 0, NI_NAMEREQD);
    if (! err)
    {
        if (name != NULL && nameLength > 0 && ! memchr (name, '\0', nameLength))
          return -1;
        return 0;
    }
    if (err != EAI_NONAME)
      return -1;
#else
    struct in_addr in;
    struct hostent * hostEntry = NULL;
#ifdef HAS_GETHOSTBYADDR_R
    struct hostent hostData;
    char buffer [2048];
    int errnum;

    in.s_addr = address -> host;

#if defined(linux) || defined(__linux) || defined(__linux__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || defined(__DragonFly__) || defined(__GNU__)
    gethostbyaddr_r ((char *) & in, sizeof (struct in_addr), AF_INET, & hostData, buffer, sizeof (buffer), & hostEntry, & errnum);
#else
    hostEntry = gethostbyaddr_r ((char *) & in, sizeof (struct in_addr), AF_INET, & hostData, buffer, sizeof (buffer), & errnum);
#endif
#else
    in.s_addr = address -> host;

    hostEntry = gethostbyaddr ((char *) & in, sizeof (struct in_addr), AF_INET);
#endif

    if (hostEntry != NULL)
    {
       size_t hostLen = strlen (hostEntry -> h_name);
       if (hostLen >= nameLength)
         return -1;
       memcpy (name, hostEntry -> h_name, hostLen + 1);
       return 0;
    }
#endif

    return enet_address_get_host_ip (address, name, nameLength);
}